

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

size_t get_onecapture(MatchState *ms,int i,char *s,char *e,char **cap)

{
  size_t sVar1;
  
  if (i < (int)(uint)ms->level) {
    sVar1 = ms->capture[i].len;
    *cap = ms->capture[i].init;
    if (sVar1 == 0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(ms->capture[i].init + (1 - (long)ms->src_init)));
    }
    else if (sVar1 == 0xffffffffffffffff) {
      luaL_error(ms->L,"unfinished capture");
    }
  }
  else {
    if (i != 0) {
      luaL_error(ms->L,"invalid capture index %%%d",(ulong)(i + 1));
    }
    *cap = s;
    sVar1 = (long)e - (long)s;
  }
  return sVar1;
}

Assistant:

static size_t get_onecapture (MatchState *ms, int i, const char *s,
                              const char *e, const char **cap) {
  if (i >= ms->level) {
    if (i != 0)
      luaL_error(ms->L, "invalid capture index %%%d", i + 1);
    *cap = s;
    return e - s;
  }
  else {
    ptrdiff_t capl = ms->capture[i].len;
    *cap = ms->capture[i].init;
    if (capl == CAP_UNFINISHED)
      luaL_error(ms->L, "unfinished capture");
    else if (capl == CAP_POSITION)
      lua_pushinteger(ms->L, (ms->capture[i].init - ms->src_init) + 1);
    return capl;
  }
}